

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O1

string * tinyusdz::io::JoinPath(string *__return_storage_ptr__,string *dir,string *filename)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  bool bVar8;
  string basedir;
  long *local_90;
  ulong local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if (dir->_M_string_length != 0) {
    local_48 = 0;
    local_40 = 0;
    local_50 = &local_40;
    if ((dir->_M_dataplus)._M_p[dir->_M_string_length - 1] == '/') {
      ::std::__cxx11::string::_M_assign((string *)&local_50);
    }
    else {
      local_70 = local_60;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/","");
      plVar5 = (long *)::std::__cxx11::string::replace
                                 ((ulong)&local_70,0,(char *)0x0,(ulong)(dir->_M_dataplus)._M_p);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_80 = *plVar6;
        lStack_78 = plVar5[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar6;
        local_90 = (long *)*plVar5;
      }
      local_88 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
    }
    if (local_48 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (filename->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + filename->_M_string_length);
    }
    else {
      local_90 = &local_80;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"./","");
      if (filename->_M_string_length < local_88) {
        bVar8 = false;
      }
      else if (local_88 == 0) {
        bVar8 = true;
      }
      else {
        iVar4 = bcmp(local_90,(filename->_M_dataplus)._M_p,local_88);
        bVar8 = iVar4 == 0;
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (bVar8) {
        local_70 = local_60;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"./","");
        uVar1 = filename->_M_string_length;
        if ((uVar1 < local_68) ||
           ((local_68 != 0 &&
            (iVar4 = bcmp(local_70,(filename->_M_dataplus)._M_p,local_68), iVar4 != 0)))) {
          pcVar2 = (filename->_M_dataplus)._M_p;
          local_90 = &local_80;
          ::std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar2,pcVar2 + uVar1);
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_90,(ulong)filename);
        }
        plVar5 = (long *)::std::__cxx11::string::replace
                                   ((ulong)&local_90,0,(char *)0x0,(ulong)local_50);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((size_type *)*plVar5 == psVar7) {
          lVar3 = plVar5[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        }
        __return_storage_ptr__->_M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_50,local_50 + local_48);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)(filename->_M_dataplus)._M_p);
      }
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (filename->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + filename->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string JoinPath(const std::string &dir, const std::string &filename) {
  if (dir.empty()) {
    return filename;
  } else {
    // check '/'
    char lastChar = *dir.rbegin();

    // TODO: Support more relative path case.

    std::string basedir;
    if (lastChar != '/') {
      basedir = dir + std::string("/");
    } else {
      basedir = dir;
    }

    if (basedir.size()) {
      if (startsWith(filename, "./")) {
        // strip "./"
        return basedir + removePrefix(filename, "./");
      }
      return basedir + filename;
    } else {
      return filename;
    }
  }
}